

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# planner.cpp
# Opt level: O3

void __thiscall duckdb::Planner::Planner(Planner *this,ClientContext *context)

{
  pointer *__ptr;
  
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->plan).
  super_unique_ptr<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t.
  super___uniq_ptr_impl<duckdb::LogicalOperator,_std::default_delete<duckdb::LogicalOperator>_>._M_t
  .super__Tuple_impl<0UL,_duckdb::LogicalOperator_*,_std::default_delete<duckdb::LogicalOperator>_>.
  super__Head_base<0UL,_duckdb::LogicalOperator_*,_false> =
       (_Head_base<0UL,_duckdb::LogicalOperator_*,_false>)0x0;
  (this->names).
  super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->types).super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
  super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->parameter_data)._M_h._M_buckets = &(this->parameter_data)._M_h._M_single_bucket;
  (this->parameter_data)._M_h._M_bucket_count = 1;
  (this->parameter_data)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->parameter_data)._M_h._M_element_count = 0;
  (this->parameter_data)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->parameter_data)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->parameter_data)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Binder::CreateBinder
            ((Binder *)&this->binder,context,(optional_ptr<duckdb::Binder,_true>)0x0,REGULAR_BINDER)
  ;
  this->context = context;
  (this->properties).read_databases._M_h._M_buckets =
       &(this->properties).read_databases._M_h._M_single_bucket;
  (this->properties).read_databases._M_h._M_bucket_count = 1;
  (this->properties).read_databases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->properties).read_databases._M_h._M_element_count = 0;
  (this->properties).read_databases._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->properties).read_databases._M_h._M_rehash_policy._M_next_resize = 0;
  (this->properties).read_databases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->properties).modified_databases._M_h._M_buckets =
       &(this->properties).modified_databases._M_h._M_single_bucket;
  (this->properties).modified_databases._M_h._M_bucket_count = 1;
  (this->properties).modified_databases._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->properties).modified_databases._M_h._M_element_count = 0;
  (this->properties).modified_databases._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->properties).modified_databases._M_h._M_rehash_policy._M_next_resize = 0;
  (this->properties).modified_databases._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->properties).requires_valid_transaction = true;
  (this->properties).allow_stream_result = false;
  (this->properties).bound_all_parameters = true;
  (this->properties).return_type = QUERY_RESULT;
  (this->properties).parameter_count = 0;
  (this->properties).always_require_rebind = false;
  (this->value_map)._M_h._M_buckets = &(this->value_map)._M_h._M_single_bucket;
  (this->value_map)._M_h._M_bucket_count = 1;
  (this->value_map)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->value_map)._M_h._M_element_count = 0;
  (this->value_map)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->value_map)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->value_map)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  return;
}

Assistant:

Planner::Planner(ClientContext &context) : binder(Binder::CreateBinder(context)), context(context) {
}